

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

void genBiomeNoise3D(BiomeNoise *bn,int *out,Range r,int opt)

{
  int iVar1;
  int iVar2;
  uint64_t *dat_00;
  int iVar3;
  uint64_t *puVar4;
  int iVar5;
  uint uVar6;
  uint64_t dat;
  
  dat = 0;
  puVar4 = (uint64_t *)0x0;
  dat_00 = &dat;
  if (opt == 0) {
    dat_00 = puVar4;
  }
  uVar6 = 1;
  if (4 < r.scale) {
    uVar6 = (uint)r.scale >> 2;
  }
  while (iVar3 = (int)puVar4, iVar3 < r.sy) {
    for (iVar1 = 0; iVar1 < r.sz; iVar1 = iVar1 + 1) {
      for (iVar5 = 0; iVar5 < r.sx; iVar5 = iVar5 + 1) {
        iVar2 = sampleBiomeNoise(bn,(int64_t *)0x0,(r.x + iVar5) * uVar6 + (uVar6 >> 1),r.y + iVar3,
                                 (r.z + iVar1) * uVar6 + (uVar6 >> 1),dat_00,(uint)(opt != 0));
        *out = iVar2;
        out = out + 1;
      }
    }
    puVar4 = (uint64_t *)(ulong)(iVar3 + 1);
  }
  return;
}

Assistant:

static void genBiomeNoise3D(const BiomeNoise *bn, int *out, Range r, int opt)
{
    uint64_t dat = 0;
    uint64_t *p_dat = opt ? &dat : NULL;
    uint32_t flags = opt ? SAMPLE_NO_SHIFT : 0;
    int i, j, k;
    int *p = out;
    int scale = r.scale > 4 ? r.scale / 4 : 1;
    int mid = scale / 2;
    for (k = 0; k < r.sy; k++)
    {
        int yk = (r.y+k);
        for (j = 0; j < r.sz; j++)
        {
            int zj = (r.z+j)*scale + mid;
            for (i = 0; i < r.sx; i++)
            {
                int xi = (r.x+i)*scale + mid;
                *p = sampleBiomeNoise(bn, NULL, xi, yk, zj, p_dat, flags);
                p++;
            }
        }
    }
}